

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

size_type __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
CopyListToTree(InnerMap *this,size_type b,Tree *tree)

{
  long lVar1;
  MapKey *this_00;
  long in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<google::protobuf::MapKey_*>,_bool> pVar2;
  Node *next;
  Node *node;
  size_type count;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  undefined8 local_28;
  undefined8 local_20;
  
  local_20 = 0;
  local_28 = *(long *)(*(long *)(in_RDI + 0x20) + in_RSI * 8);
  while (local_28 != 0) {
    this_00 = KeyPtrFromNodePtr((Node *)0x6f6ebf);
    pVar2 = std::
            set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
            ::insert((set<google::protobuf::MapKey_*,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
                      *)this_00,
                     (value_type *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
    in_stack_ffffffffffffffc8 = pVar2.second;
    local_20 = local_20 + 1;
    lVar1 = *(long *)(local_28 + 0x18);
    *(undefined8 *)(local_28 + 0x18) = 0;
    local_28 = lVar1;
  }
  return local_20;
}

Assistant:

size_type CopyListToTree(size_type b, Tree* tree) {
      size_type count = 0;
      Node* node = static_cast<Node*>(table_[b]);
      while (node != NULL) {
        tree->insert(KeyPtrFromNodePtr(node));
        ++count;
        Node* next = node->next;
        node->next = NULL;
        node = next;
      }
      return count;
    }